

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::writeBasisFile(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,char *filename,NameSet *rowNames,NameSet *colNames,bool cpxFormat)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  _Setw _Var5;
  ostream *poVar6;
  VarStatus *pVVar7;
  RangeType *pRVar8;
  char *pcVar9;
  long in_RCX;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  byte in_R8B;
  int col;
  int row;
  int numCols;
  int numRows;
  ofstream file;
  ostream *in_stack_fffffffffffffd38;
  int pnum;
  NameSet *in_stack_fffffffffffffd40;
  int local_250;
  int local_24c;
  ostream local_230 [399];
  bool in_stack_ffffffffffffff5f;
  NameSet *in_stack_ffffffffffffff60;
  NameSet *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff78;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x5700) & 1) == 0) {
    std::ofstream::ofstream(local_230,in_RSI,_S_out);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      local_1 = false;
    }
    else {
      std::ios_base::setf((ios_base *)in_stack_fffffffffffffd40,
                          (fmtflags)((ulong)in_stack_fffffffffffffd38 >> 0x20));
      poVar6 = std::operator<<(local_230,"NAME  ");
      poVar6 = std::operator<<(poVar6,in_RSI);
      std::operator<<(poVar6,"\n");
      if ((*(byte *)(in_RDI + 0x64d0) & 1) == 0) {
        std::operator<<(local_230,"ENDATA\n");
        local_1 = true;
      }
      else {
        iVar3 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                ::size((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                        *)(in_RDI + 0x6130));
        iVar4 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                ::size((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                        *)(in_RDI + 0x6148));
        local_24c = 0;
        for (local_250 = 0; local_250 < iVar4; local_250 = local_250 + 1) {
          pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[]((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                 *)(in_RDI + 0x6148),local_250);
          pnum = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
          if (*pVVar7 == BASIC) {
            while ((local_24c < iVar3 &&
                   (pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                             ::operator[]((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                           *)(in_RDI + 0x6130),local_24c), *pVVar7 == BASIC))) {
              local_24c = local_24c + 1;
            }
            pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                     ::operator[]((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                   *)(in_RDI + 0x6130),local_24c);
            if ((*pVVar7 == ON_UPPER) &&
               (((in_R8B & 1) == 0 ||
                (pRVar8 = DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
                          ::operator[]((DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
                                        *)(in_RDI + 0x6110),local_24c), *pRVar8 == RANGETYPE_BOXED))
               )) {
              std::operator<<(local_230," XU ");
            }
            else {
              std::operator<<(local_230," XL ");
            }
            _Var5 = std::setw(8);
            std::operator<<(local_230,_Var5);
            if ((in_RCX == 0) || (bVar2 = NameSet::has(in_stack_fffffffffffffd40,pnum), !bVar2)) {
              poVar6 = std::operator<<(local_230,"x");
              std::ostream::operator<<(poVar6,local_250);
            }
            else {
              pcVar9 = NameSet::operator[](in_stack_fffffffffffffd40,pnum);
              std::operator<<(local_230,pcVar9);
            }
            std::operator<<(local_230,"       ");
            if ((in_RDX == 0) || (bVar2 = NameSet::has(in_stack_fffffffffffffd40,pnum), !bVar2)) {
              poVar6 = std::operator<<(local_230,"C");
              std::ostream::operator<<(poVar6,local_24c);
            }
            else {
              pcVar9 = NameSet::operator[](in_stack_fffffffffffffd40,pnum);
              std::operator<<(local_230,pcVar9);
            }
            std::operator<<(local_230,"\n");
            local_24c = local_24c + 1;
          }
          else {
            pVVar7 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                     ::operator[]((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                   *)(in_RDI + 0x6148),local_250);
            if (*pVVar7 == ON_UPPER) {
              std::operator<<(local_230," UL ");
              _Var5 = std::setw(8);
              std::operator<<(local_230,_Var5);
              if ((in_RCX == 0) || (bVar2 = NameSet::has(in_stack_fffffffffffffd40,pnum), !bVar2)) {
                in_stack_fffffffffffffd38 = std::operator<<(local_230,"x");
                std::ostream::operator<<(in_stack_fffffffffffffd38,local_250);
              }
              else {
                in_stack_fffffffffffffd40 =
                     (NameSet *)NameSet::operator[](in_stack_fffffffffffffd40,pnum);
                std::operator<<(local_230,(char *)in_stack_fffffffffffffd40);
              }
              std::operator<<(local_230,"\n");
            }
          }
        }
        std::operator<<(local_230,"ENDATA\n");
        local_1 = true;
      }
    }
    std::ofstream::~ofstream(local_230);
  }
  else {
    local_1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::writeBasisFile(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                               in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                               in_stack_ffffffffffffff5f);
  }
  return local_1;
}

Assistant:

bool SoPlexBase<R>::writeBasisFile(const char* filename, const NameSet* rowNames,
                                   const NameSet* colNames, const bool cpxFormat) const
{
   assert(filename != nullptr);

   if(_isRealLPLoaded)
      return _solver.writeBasisFile(filename, rowNames, colNames, cpxFormat);
   else
   {
      std::ofstream file(filename);

      if(!file.good())
         return false;

      file.setf(std::ios::left);
      file << "NAME  " << filename << "\n";

      // do not write basis if there is none
      if(!_hasBasis)
      {
         file << "ENDATA\n";
         return true;
      }

      // start writing
      int numRows = _basisStatusRows.size();
      int numCols = _basisStatusCols.size();
      int row = 0;

      for(int col = 0; col < numCols; col++)
      {
         assert(_basisStatusCols[col] != SPxSolverBase<R>::UNDEFINED);

         if(_basisStatusCols[col] == SPxSolverBase<R>::BASIC)
         {
            // find nonbasic row
            for(; row < numRows; row++)
            {
               assert(_basisStatusRows[row] != SPxSolverBase<R>::UNDEFINED);

               if(_basisStatusRows[row] != SPxSolverBase<R>::BASIC)
                  break;
            }

            assert(row != numRows);

            if(_basisStatusRows[row] == SPxSolverBase<R>::ON_UPPER && (!cpxFormat
                  || _rowTypes[row] == SoPlexBase<R>::RANGETYPE_BOXED))
               file << " XU ";
            else
               file << " XL ";

            file << std::setw(8);

            if(colNames != nullptr && colNames->has(col))
               file << (*colNames)[col];
            else
               file << "x" << col;

            file << "       ";

            if(rowNames != nullptr && rowNames->has(row))
               file << (*rowNames)[row];
            else
               file << "C" << row;

            file << "\n";
            row++;
         }
         else
         {
            if(_basisStatusCols[col] == SPxSolverBase<R>::ON_UPPER)
            {
               file << " UL ";

               file << std::setw(8);

               if(colNames != nullptr && colNames->has(col))
                  file << (*colNames)[col];
               else
                  file << "x" << col;

               file << "\n";
            }
         }
      }

      file << "ENDATA\n";

#ifndef NDEBUG

      // check that the remaining rows are basic
      for(; row < numRows; row++)
      {
         assert(_basisStatusRows[row] == SPxSolverBase<R>::BASIC);
      }

#endif

      return true;
   }
}